

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

VkImageViewType vkt::texture::util::textureTypeToImageViewType(Type type)

{
  if (type - TYPE_CUBE_MAP < 3) {
    return *(VkImageViewType *)(&DAT_009cce1c + (ulong)(type - TYPE_CUBE_MAP) * 4);
  }
  return VK_IMAGE_VIEW_TYPE_2D;
}

Assistant:

VkImageViewType textureTypeToImageViewType (TextureBinding::Type type)
{
	switch (type)
	{
		case TextureBinding::TYPE_2D:			return VK_IMAGE_VIEW_TYPE_2D;
		case TextureBinding::TYPE_2D_ARRAY:		return VK_IMAGE_VIEW_TYPE_2D_ARRAY;
		case TextureBinding::TYPE_CUBE_MAP:		return VK_IMAGE_VIEW_TYPE_CUBE;
		case TextureBinding::TYPE_3D:			return VK_IMAGE_VIEW_TYPE_3D;
		default:
			DE_ASSERT(false);
	}

	return VK_IMAGE_VIEW_TYPE_2D;
}